

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask sqlite3WhereExprUsageFull(WhereMaskSet *pMaskSet,Expr *p)

{
  WhereMaskSet *pMaskSet_00;
  Bitmask BVar1;
  WhereMaskSet *pWVar2;
  ExprList *pList;
  ulong uVar3;
  WhereMaskSet *in_RSI;
  WhereMaskSet *in_RDI;
  Bitmask mask;
  WhereMaskSet *in_stack_ffffffffffffffd8;
  
  if ((char)in_RSI->bVarSelect == -0x4d) {
    pMaskSet_00 = (WhereMaskSet *)sqlite3WhereGetMask(in_RDI,in_RSI->ix[9]);
  }
  else {
    pMaskSet_00 = (WhereMaskSet *)0x0;
  }
  pWVar2 = pMaskSet_00;
  if (*(long *)(in_RSI->ix + 2) != 0) {
    BVar1 = sqlite3WhereExprUsageNN(in_stack_ffffffffffffffd8,(Expr *)0x201d57);
    pWVar2 = (WhereMaskSet *)(BVar1 | (ulong)pWVar2);
  }
  if (*(long *)(in_RSI->ix + 4) == 0) {
    if ((in_RSI->n & 0x1000U) == 0) {
      if (*(long *)(in_RSI->ix + 6) != 0) {
        BVar1 = sqlite3WhereExprListUsage(in_RSI,(ExprList *)pWVar2);
        pWVar2 = (WhereMaskSet *)(BVar1 | (ulong)pWVar2);
      }
    }
    else {
      if ((in_RSI->n & 0x40U) != 0) {
        in_RDI->bVarSelect = 1;
      }
      BVar1 = exprSelectUsage(in_RSI,(Select *)pWVar2);
      pWVar2 = (WhereMaskSet *)(BVar1 | (ulong)pWVar2);
    }
  }
  else {
    BVar1 = sqlite3WhereExprUsageNN(in_stack_ffffffffffffffd8,(Expr *)0x201d80);
    pWVar2 = (WhereMaskSet *)(BVar1 | (ulong)pWVar2);
  }
  if ((((char)in_RSI->bVarSelect == -0x54) || ((char)in_RSI->bVarSelect == -0x57)) &&
     ((in_RSI->n & 0x1000000U) != 0)) {
    BVar1 = sqlite3WhereExprListUsage(in_RSI,(ExprList *)pWVar2);
    pList = (ExprList *)(BVar1 | (ulong)pWVar2);
    BVar1 = sqlite3WhereExprListUsage(in_RSI,pList);
    uVar3 = BVar1 | (ulong)pList;
    BVar1 = sqlite3WhereExprUsage(pMaskSet_00,(Expr *)in_stack_ffffffffffffffd8);
    pWVar2 = (WhereMaskSet *)(BVar1 | uVar3);
  }
  return (Bitmask)pWVar2;
}

Assistant:

static SQLITE_NOINLINE Bitmask sqlite3WhereExprUsageFull(
  WhereMaskSet *pMaskSet,
  Expr *p
){
  Bitmask mask;
  mask = (p->op==TK_IF_NULL_ROW) ? sqlite3WhereGetMask(pMaskSet, p->iTable) : 0;
  if( p->pLeft ) mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pLeft);
  if( p->pRight ){
    mask |= sqlite3WhereExprUsageNN(pMaskSet, p->pRight);
    assert( p->x.pList==0 );
  }else if( ExprUseXSelect(p) ){
    if( ExprHasProperty(p, EP_VarSelect) ) pMaskSet->bVarSelect = 1;
    mask |= exprSelectUsage(pMaskSet, p->x.pSelect);
  }else if( p->x.pList ){
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->x.pList);
  }
#ifndef SQLITE_OMIT_WINDOWFUNC
  if( (p->op==TK_FUNCTION || p->op==TK_AGG_FUNCTION) && ExprUseYWin(p) ){
    assert( p->y.pWin!=0 );
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pPartition);
    mask |= sqlite3WhereExprListUsage(pMaskSet, p->y.pWin->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, p->y.pWin->pFilter);
  }
#endif
  return mask;
}